

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O0

string * GetHIDUsagePageName_abi_cxx11_(U16 usagePage)

{
  ushort in_SI;
  undefined6 in_register_0000003a;
  string *this;
  string local_80 [32];
  string local_60 [35];
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [18];
  allocator local_13 [3];
  string *psStack_10;
  U16 usagePage_local;
  
  this = (string *)CONCAT62(in_register_0000003a,usagePage);
  psStack_10 = this;
  switch(in_SI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Undefined",local_13);
    std::allocator<char>::~allocator((allocator<char> *)local_13);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Generic Desktop Controls",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Simulation Controls",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"VR Controls",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Sport Controls",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Game Controls",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Generic Device Controls",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Keyboard/Keypad",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"LEDs",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Button",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Ordinal",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Telephony",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Consumer",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Digitizer",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  default:
    if (in_SI < 0xff00) {
      int2str_sal_abi_cxx11_((U64)local_80,(uint)in_SI,2);
      std::operator+((char *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Reserved ");
      std::__cxx11::string::~string(local_80);
    }
    else {
      int2str_sal_abi_cxx11_((U64)local_60,(uint)in_SI,2);
      std::operator+((char *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Vendor Usage ");
      std::__cxx11::string::~string(local_60);
    }
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"PID Page",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Unicode",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 0x14:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Alphanumeric Display",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case 0x40:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Medical Instruments",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Monitor page",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Power page",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case 0x8c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Bar Code Scanner page",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    break;
  case 0x8d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Scale page",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case 0x8e:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Magnetic Stripe Reading (MSR) Devices",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    break;
  case 0x8f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Reserved Point of Sale pages",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    break;
  case 0x90:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Camera Control Page",&local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    break;
  case 0x91:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Arcade Page",&local_3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
  }
  return this;
}

Assistant:

std::string GetHIDUsagePageName( U16 usagePage )
{
    switch( usagePage )
    {
    case 0x00:
        return "Undefined";
    case 0x01:
        return "Generic Desktop Controls";
    case 0x02:
        return "Simulation Controls";
    case 0x03:
        return "VR Controls";
    case 0x04:
        return "Sport Controls";
    case 0x05:
        return "Game Controls";
    case 0x06:
        return "Generic Device Controls";
    case 0x07:
        return "Keyboard/Keypad";
    case 0x08:
        return "LEDs";
    case 0x09:
        return "Button";
    case 0x0A:
        return "Ordinal";
    case 0x0B:
        return "Telephony";
    case 0x0C:
        return "Consumer";
    case 0x0D:
        return "Digitizer";
    case 0x0F:
        return "PID Page";
    case 0x10:
        return "Unicode";
    case 0x14:
        return "Alphanumeric Display";
    case 0x40:
        return "Medical Instruments";
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
        return "Monitor page";
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
        return "Power page";
    case 0x8C:
        return "Bar Code Scanner page";
    case 0x8D:
        return "Scale page";
    case 0x8E:
        return "Magnetic Stripe Reading (MSR) Devices";
    case 0x8F:
        return "Reserved Point of Sale pages";
    case 0x90:
        return "Camera Control Page";
    case 0x91:
        return "Arcade Page";
    }

    if( usagePage >= 0xff00 )
        return "Vendor Usage " + int2str_sal( usagePage, Hexadecimal, 16 );

    return "Reserved " + int2str_sal( usagePage, Hexadecimal, usagePage > 0xff ? 16 : 8 );
}